

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

bool tinyusdz::ConvertTokenAttributeToStringAttribute
               (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *inp,
               TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pSVar3;
  bool bVar4;
  Sample *item;
  pointer pSVar5;
  TypedTimeSamples<tinyusdz::Token> tok_ts;
  Animatable<tinyusdz::Token> toks;
  Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> strs;
  undefined1 local_e0 [17];
  undefined7 uStack_cf;
  bool local_c8;
  Animatable<tinyusdz::Token> local_c0;
  Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  
  AttrMetas::operator=(&out->_metas,(AttrMetas *)inp);
  if (inp[0x278] == (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>)0x1) {
    out->_blocked = true;
    return true;
  }
  if (((*(long *)(inp + 0x218) == *(long *)(inp + 0x210)) &&
      (inp[0x228] == (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>)0x0)) &&
     (inp[0x208] == (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>)0x1)) {
    out->_value_empty = true;
    return true;
  }
  if ((*(long *)(inp + 0x218) != *(long *)(inp + 0x210)) && (((byte)inp[0x228] & 1) == 0)) {
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&out->_paths,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(inp + 0x210)
              );
    return true;
  }
  paVar1 = &local_c0._value.str_.field_2;
  local_c0._value.str_._M_string_length = 0;
  local_c0._value.str_.field_2._M_local_buf[0] = '\0';
  local_c0._has_value = false;
  local_c0._blocked = false;
  local_c0._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_c0._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_c0._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_c0._ts._17_8_ = 0;
  paVar2 = &local_78._value.field_2;
  local_78._value._M_string_length = 0;
  local_78._value.field_2._M_local_buf[0] = '\0';
  local_78._has_value = false;
  local_78._blocked = false;
  local_78._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_78._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_78._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_78._ts._17_8_ = 0;
  local_c0._value.str_._M_dataplus._M_p = (pointer)paVar1;
  local_78._value._M_dataplus._M_p = (pointer)paVar2;
  bVar4 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::get_value(inp,&local_c0);
  if (bVar4) {
    if (local_c0._ts._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pointer)CONCAT71(local_c0._ts._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                          local_c0._ts._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_1_) &&
        local_c0._blocked == false) {
      local_e0._0_8_ = local_e0 + 0x10;
      local_e0._8_8_ = (pointer)0x0;
      local_e0[0x10] = 0;
      if ((local_c0._blocked == false) && (local_c0._has_value == true)) {
        std::__cxx11::string::_M_assign((string *)local_e0);
      }
      std::__cxx11::string::_M_assign((string *)&local_78);
      local_78._has_value = true;
      local_78._blocked = false;
      if ((pointer)local_e0._0_8_ != (pointer)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_,CONCAT71(uStack_cf,local_e0[0x10]) + 1);
      }
    }
    else {
      if (local_c0._blocked != false) {
        bVar4 = false;
        goto LAB_001327dc;
      }
      if (local_c0._ts._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)CONCAT71(local_c0._ts._samples.
                            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
                            ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                            local_c0._ts._samples.
                            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
                            ._M_impl.super__Vector_impl_data._M_finish._0_1_) &&
          local_c0._has_value == false) {
        std::
        vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
        ::vector((vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
                  *)local_e0,&local_c0._ts._samples);
        local_c8 = local_c0._ts._dirty;
        pSVar5 = (pointer)local_e0._0_8_;
        pSVar3 = (pointer)local_e0._8_8_;
        if (local_c0._ts._dirty == true) {
          TypedTimeSamples<tinyusdz::Token>::update((TypedTimeSamples<tinyusdz::Token> *)local_e0);
          pSVar5 = (pointer)local_e0._0_8_;
          pSVar3 = (pointer)local_e0._8_8_;
        }
        for (; pSVar5 != pSVar3; pSVar5 = pSVar5 + 1) {
          TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::add_sample(&local_78._ts,pSVar5->t,&(pSVar5->value).str_);
        }
        std::
        vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
        ::~vector((vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
                   *)local_e0);
      }
    }
  }
  nonstd::optional_lite::optional<tinyusdz::Animatable<std::__cxx11::string>>::operator=
            ((optional<tinyusdz::Animatable<std::__cxx11::string>> *)&out->_attrib,&local_78);
  bVar4 = true;
LAB_001327dc:
  std::
  vector<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
  ::~vector(&local_78._ts._samples);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._value._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._value._M_dataplus._M_p,
                    CONCAT71(local_78._value.field_2._M_allocated_capacity._1_7_,
                             local_78._value.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
  ::~vector(&local_c0._ts._samples);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._value.str_._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._value.str_._M_dataplus._M_p,
                    CONCAT71(local_c0._value.str_.field_2._M_allocated_capacity._1_7_,
                             local_c0._value.str_.field_2._M_local_buf[0]) + 1);
  }
  if (bVar4) {
    return true;
  }
  return false;
}

Assistant:

bool ConvertTokenAttributeToStringAttribute(
    const TypedAttribute<Animatable<value::token>> &inp,
    TypedAttribute<Animatable<std::string>> &out) {
  
    out.metas() = inp.metas();
  
    if (inp.is_blocked()) {
      out.set_blocked(true);
    } else if (inp.is_value_empty()) {
      out.set_value_empty();
    } else if (inp.is_connection()) {
      out.set_connections(inp.get_connections());
    } else {
      Animatable<value::token> toks;
      Animatable<std::string> strs;
      if (inp.get_value(&toks)) {
        if (toks.is_scalar()) {
          value::token tok;
          toks.get_scalar(&tok);
          strs.set(tok.str());
        } else if (toks.is_timesamples()) {
          auto tok_ts = toks.get_timesamples();
  
          for (auto &item : tok_ts.get_samples()) {
            strs.add_sample(item.t, item.value.str());
          }
        } else if (toks.is_blocked()) {
          // TODO
          return false;
        }
      }
      out.set_value(strs);
    }
  
    return true;
  }